

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_aa32_ld_i32(DisasContext_conflict1 *s,TCGv_i32 val,TCGv_i32 a32,int index,MemOp opc)

{
  TCGContext_conflict1 *tcg_ctx_00;
  int iVar1;
  TCGv_i64 addr_00;
  TCGv_i64 addr;
  TCGContext_conflict1 *tcg_ctx;
  MemOp opc_local;
  int index_local;
  TCGv_i32 a32_local;
  TCGv_i32 val_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  iVar1 = arm_dc_feature(s,9);
  tcg_ctx._0_4_ = opc;
  if (iVar1 != 0) {
    iVar1 = arm_dc_feature(s,0x26);
    if (iVar1 == 0) {
      tcg_ctx._0_4_ = opc | MO_ALIGN;
    }
  }
  addr_00 = gen_aa32_addr(s,a32,(MemOp)tcg_ctx);
  tcg_gen_qemu_ld_i32_aarch64(tcg_ctx_00,val,addr_00,(long)index,(MemOp)tcg_ctx);
  tcg_temp_free_i64(tcg_ctx_00,addr_00);
  return;
}

Assistant:

static void gen_aa32_ld_i32(DisasContext *s, TCGv_i32 val, TCGv_i32 a32,
                            int index, MemOp opc)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv addr;

    if (arm_dc_feature(s, ARM_FEATURE_M) &&
        !arm_dc_feature(s, ARM_FEATURE_M_MAIN)) {
        opc |= MO_ALIGN;
    }

    addr = gen_aa32_addr(s, a32, opc);
    tcg_gen_qemu_ld_i32(tcg_ctx, val, addr, index, opc);
    tcg_temp_free(tcg_ctx, addr);
}